

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O0

bool __thiscall argagg::option_result::as<bool>(option_result *this,bool *t)

{
  byte *in_RSI;
  long *in_RDI;
  undefined1 local_1;
  
  if (*in_RDI == 0) {
    local_1 = (bool)(*in_RSI & 1);
  }
  else {
    local_1 = convert::arg<bool>((char *)0x11a7ab);
  }
  return local_1;
}

Assistant:

T option_result::as(const T& t) const
{
  if (this->arg) {
    try {
      return convert::arg<T>(this->arg);
    } catch (...) {
      return t;
    }
  } else {
    // I actually think this will never happen. To call this method you have
    // to access a specific option_result for an option. If there's a
    // specific option_result then the option was found. If the option
    // requires an argument then it will definitely have an argument
    // otherwise the parser would have complained.
    return t;
  }
}